

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_check_poc_val
                   (opj_poc_t *p_pocs,OPJ_UINT32 p_nb_pocs,OPJ_UINT32 p_nb_resolutions,
                   OPJ_UINT32 p_num_comps,OPJ_UINT32 p_num_layers,opj_event_mgr_t *p_manager)

{
  bool bVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  OPJ_BOOL extraout_EAX;
  OPJ_BOOL OVar4;
  void *ptr;
  int iVar5;
  uint uVar6;
  uint uVar7;
  OPJ_UINT32 OVar8;
  uint uVar9;
  uint uVar10;
  OPJ_UINT32 OVar11;
  int iVar12;
  int iVar13;
  
  iVar13 = p_num_comps * p_nb_resolutions;
  ptr = opj_calloc((ulong)(iVar13 * p_num_layers),4);
  if (ptr != (void *)0x0) {
    uVar2 = p_pocs->resno0;
    if (uVar2 < p_pocs->resno1) {
      iVar5 = uVar2 * p_num_comps;
      do {
        uVar6 = p_pocs->compno0;
        if (uVar6 < p_pocs->compno1) {
          uVar7 = uVar6 + iVar5;
          do {
            if (p_pocs->layno1 != 0) {
              uVar9 = 0;
              uVar10 = uVar7;
              do {
                *(undefined4 *)((long)ptr + (ulong)uVar10 * 4) = 1;
                uVar10 = uVar10 + iVar13;
                uVar9 = uVar9 + 1;
              } while (uVar9 < p_pocs->layno1);
            }
            uVar7 = uVar7 + 1;
            uVar6 = uVar6 + 1;
          } while (uVar6 < p_pocs->compno1);
        }
        iVar5 = iVar5 + p_num_comps;
        uVar2 = uVar2 + 1;
      } while (uVar2 < p_pocs->resno1);
    }
    if (1 < p_nb_pocs) {
      OVar3 = 1;
      do {
        uVar2 = p_pocs->layno1;
        if (p_pocs[1].layno1 <= uVar2) {
          uVar2 = 0;
        }
        uVar6 = p_pocs[1].resno0;
        if (uVar6 < p_pocs[1].resno1) {
          iVar5 = uVar6 * p_num_comps;
          do {
            uVar7 = p_pocs[1].compno0;
            if (uVar7 < p_pocs[1].compno1) {
              iVar12 = uVar7 + iVar5;
              do {
                if (uVar2 < p_pocs[1].layno1) {
                  uVar9 = iVar12 + uVar2 * iVar13;
                  uVar10 = uVar2;
                  do {
                    *(undefined4 *)((long)ptr + (ulong)uVar9 * 4) = 1;
                    uVar9 = uVar9 + iVar13;
                    uVar10 = uVar10 + 1;
                  } while (uVar10 < p_pocs[1].layno1);
                }
                iVar12 = iVar12 + 1;
                uVar7 = uVar7 + 1;
              } while (uVar7 < p_pocs[1].compno1);
            }
            iVar5 = iVar5 + p_num_comps;
            uVar6 = uVar6 + 1;
          } while (uVar6 < p_pocs[1].resno1);
        }
        p_pocs = p_pocs + 1;
        OVar3 = OVar3 + 1;
      } while (OVar3 != p_nb_pocs);
    }
    if (p_num_layers != 0) {
      bVar1 = false;
      iVar5 = 0;
      OVar3 = 0;
      do {
        if (p_nb_resolutions != 0) {
          OVar8 = 0;
          iVar12 = iVar5;
          do {
            if (p_num_comps != 0) {
              OVar11 = 0;
              do {
                bVar1 = (bool)(bVar1 | *(int *)((long)ptr + (ulong)(iVar12 + OVar11) * 4) != 1);
                OVar11 = OVar11 + 1;
              } while (p_num_comps != OVar11);
            }
            OVar8 = OVar8 + 1;
            iVar12 = iVar12 + p_num_comps;
          } while (OVar8 != p_nb_resolutions);
          iVar5 = iVar5 + iVar13;
        }
        OVar3 = OVar3 + 1;
      } while (OVar3 != p_num_layers);
      if (bVar1) {
        opj_event_msg(p_manager,1,"Missing packets possible loss of data\n");
      }
    }
    opj_free(ptr);
    return extraout_EAX;
  }
  OVar4 = opj_event_msg(p_manager,1,"Not enough memory for checking the poc values.\n");
  return OVar4;
}

Assistant:

static OPJ_BOOL opj_j2k_check_poc_val(const opj_poc_t *p_pocs,
                                      OPJ_UINT32 p_nb_pocs,
                                      OPJ_UINT32 p_nb_resolutions,
                                      OPJ_UINT32 p_num_comps,
                                      OPJ_UINT32 p_num_layers,
                                      opj_event_mgr_t * p_manager)
{
    OPJ_UINT32* packet_array;
    OPJ_UINT32 index, resno, compno, layno;
    OPJ_UINT32 i;
    OPJ_UINT32 step_c = 1;
    OPJ_UINT32 step_r = p_num_comps * step_c;
    OPJ_UINT32 step_l = p_nb_resolutions * step_r;
    OPJ_BOOL loss = OPJ_FALSE;
    OPJ_UINT32 layno0 = 0;

    packet_array = (OPJ_UINT32*) opj_calloc(step_l * p_num_layers,
                                            sizeof(OPJ_UINT32));
    if (packet_array == 00) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough memory for checking the poc values.\n");
        return OPJ_FALSE;
    }

    if (p_nb_pocs == 0) {
        opj_free(packet_array);
        return OPJ_TRUE;
    }

    index = step_r * p_pocs->resno0;
    /* take each resolution for each poc */
    for (resno = p_pocs->resno0 ; resno < p_pocs->resno1 ; ++resno) {
        OPJ_UINT32 res_index = index + p_pocs->compno0 * step_c;

        /* take each comp of each resolution for each poc */
        for (compno = p_pocs->compno0 ; compno < p_pocs->compno1 ; ++compno) {
            OPJ_UINT32 comp_index = res_index + layno0 * step_l;

            /* and finally take each layer of each res of ... */
            for (layno = layno0; layno < p_pocs->layno1 ; ++layno) {
                /*index = step_r * resno + step_c * compno + step_l * layno;*/
                packet_array[comp_index] = 1;
                comp_index += step_l;
            }

            res_index += step_c;
        }

        index += step_r;
    }
    ++p_pocs;

    /* iterate through all the pocs */
    for (i = 1; i < p_nb_pocs ; ++i) {
        OPJ_UINT32 l_last_layno1 = (p_pocs - 1)->layno1 ;

        layno0 = (p_pocs->layno1 > l_last_layno1) ? l_last_layno1 : 0;
        index = step_r * p_pocs->resno0;

        /* take each resolution for each poc */
        for (resno = p_pocs->resno0 ; resno < p_pocs->resno1 ; ++resno) {
            OPJ_UINT32 res_index = index + p_pocs->compno0 * step_c;

            /* take each comp of each resolution for each poc */
            for (compno = p_pocs->compno0 ; compno < p_pocs->compno1 ; ++compno) {
                OPJ_UINT32 comp_index = res_index + layno0 * step_l;

                /* and finally take each layer of each res of ... */
                for (layno = layno0; layno < p_pocs->layno1 ; ++layno) {
                    /*index = step_r * resno + step_c * compno + step_l * layno;*/
                    packet_array[comp_index] = 1;
                    comp_index += step_l;
                }

                res_index += step_c;
            }

            index += step_r;
        }

        ++p_pocs;
    }

    index = 0;
    for (layno = 0; layno < p_num_layers ; ++layno) {
        for (resno = 0; resno < p_nb_resolutions; ++resno) {
            for (compno = 0; compno < p_num_comps; ++compno) {
                loss |= (packet_array[index] != 1);
                /*index = step_r * resno + step_c * compno + step_l * layno;*/
                index += step_c;
            }
        }
    }

    if (loss) {
        opj_event_msg(p_manager, EVT_ERROR, "Missing packets possible loss of data\n");
    }

    opj_free(packet_array);

    return !loss;
}